

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O0

void __thiscall CaDiCaL::LratChecker::insert(LratChecker *this)

{
  uint64_t uVar1;
  LratCheckerClause *pLVar2;
  LratChecker *in_RDI;
  LratCheckerClause *c;
  uint64_t h;
  LratChecker *in_stack_00000070;
  
  (in_RDI->stats).insertions = (in_RDI->stats).insertions + 1;
  if (in_RDI->num_clauses == in_RDI->size_clauses) {
    enlarge_clauses(this);
  }
  uVar1 = compute_hash(in_RDI,in_RDI->last_id);
  uVar1 = reduce_hash(uVar1,in_RDI->size_clauses);
  pLVar2 = new_clause(in_stack_00000070);
  pLVar2->next = in_RDI->clauses[uVar1];
  in_RDI->clauses[uVar1] = pLVar2;
  return;
}

Assistant:

void LratChecker::insert () {
  stats.insertions++;
  if (num_clauses == size_clauses)
    enlarge_clauses ();
  const uint64_t h = reduce_hash (compute_hash (last_id), size_clauses);
  LratCheckerClause *c = new_clause ();
  c->next = clauses[h];
  clauses[h] = c;
}